

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O1

vec4 vec4_apply_mat(vec4 v,mat4 m)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  vec4 vVar5;
  
  fVar1 = v.x;
  fVar2 = v.y;
  fVar3 = v.z;
  fVar4 = v.w;
  vVar5.x = m.m[3] * fVar4 + m.m[2] * fVar3 + m.m[0] * fVar1 + m.m[1] * fVar2;
  vVar5.y = m.m[7] * fVar4 + m.m[6] * fVar3 + m.m[4] * fVar1 + m.m[5] * fVar2;
  vVar5.z = m.m[0xb] * fVar4 + m.m[10] * fVar3 + m.m[8] * fVar1 + m.m[9] * fVar2;
  vVar5.w = fVar4 * m.m[0xf] + m.m[0xe] * fVar3 + m.m[0xc] * fVar1 + fVar2 * m.m[0xd];
  return vVar5;
}

Assistant:

vec4 vec4_apply_mat(vec4 v, mat4 m) {
    float x = m.m[0] * v.x + m.m[1] * v.y + m.m[2] * v.z + m.m[3] * v.w;
    float y = m.m[4] * v.x + m.m[5] * v.y + m.m[6] * v.z + m.m[7] * v.w;
    float z = m.m[8] * v.x + m.m[9] * v.y + m.m[10] * v.z + m.m[11] * v.w;
    float w = m.m[12] * v.x + m.m[13] * v.y + m.m[14] * v.z + m.m[15] * v.w;
    return vec4_create(x, y, z, w);
}